

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

void __thiscall
capnp::compiler::NodeTranslator::NodeTranslator
          (NodeTranslator *this,Resolver *resolver,ErrorReporter *errorReporter,Reader *decl,
          Orphan<capnp::schema::Node> *wipNodeParam,bool compileAnnotations)

{
  uint *puVar1;
  Builder builder;
  StructReader decl_00;
  BuilderArena *pBVar2;
  CapTableBuilder *pCVar3;
  BrandScope *this_00;
  uint64_t startingScopeId;
  StructBuilder local_100;
  StructReader local_d8;
  PointerReader local_a8;
  StructBuilder local_88;
  ListReader local_60;
  
  this->resolver = resolver;
  this->errorReporter = errorReporter;
  capnp::_::OrphanBuilder::asStruct(&local_88,&wipNodeParam->builder,(StructSize)0x60006);
  local_d8.dataSize = local_88.dataSize;
  local_d8.pointerCount = local_88.pointerCount;
  local_d8._38_2_ = local_88._38_2_;
  local_d8.data = local_88.data;
  local_d8.pointers = local_88.pointers;
  local_d8.segment = &(local_88.segment)->super_SegmentReader;
  local_d8.capTable = &(local_88.capTable)->super_CapTableReader;
  pBVar2 = capnp::_::StructBuilder::getArena((StructBuilder *)&local_d8);
  pCVar3 = capnp::_::StructBuilder::getCapTable((StructBuilder *)&local_d8);
  (this->orphanage).arena = pBVar2;
  (this->orphanage).capTable = pCVar3;
  this->compileAnnotations = compileAnnotations;
  capnp::_::OrphanBuilder::asStructReader(&local_d8,&wipNodeParam->builder,(StructSize)0x60006);
  if (local_d8.dataSize < 0x40) {
    startingScopeId = 0;
  }
  else {
    startingScopeId = *local_d8.data;
  }
  if ((decl->_reader).pointerCount < 8) {
    local_a8.nestingLimit = 0x7fffffff;
    local_a8.capTable = (CapTableReader *)0x0;
    local_a8.pointer = (WirePointer *)0x0;
    local_a8.segment = (SegmentReader *)0x0;
  }
  else {
    local_a8.segment = (decl->_reader).segment;
    local_a8.capTable = (decl->_reader).capTable;
    local_a8.pointer = (decl->_reader).pointers + 7;
    local_a8.nestingLimit = (decl->_reader).nestingLimit;
  }
  capnp::_::PointerReader::getList(&local_60,&local_a8,INLINE_COMPOSITE,(word *)0x0);
  this_00 = (BrandScope *)operator_new(0x50);
  BrandScope::BrandScope(this_00,errorReporter,startingScopeId,local_60.elementCount,resolver);
  puVar1 = &(this_00->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  (this->localBrand).disposer = (Disposer *)this_00;
  (this->localBrand).ptr = this_00;
  (this->wipNode).builder.segment = (wipNodeParam->builder).segment;
  (this->wipNode).builder.capTable = (wipNodeParam->builder).capTable;
  (this->wipNode).builder.location = (wipNodeParam->builder).location;
  (this->wipNode).builder.tag.content = (wipNodeParam->builder).tag.content;
  (wipNodeParam->builder).segment = (SegmentBuilder *)0x0;
  (wipNodeParam->builder).location = (word *)0x0;
  Orphanage::newOrphan<capnp::schema::Node::SourceInfo>(&this->sourceInfo,&this->orphanage);
  (this->groups).builder.ptr = (AuxNode *)0x0;
  (this->groups).builder.pos = (RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *)0x0;
  (this->groups).builder.endPtr = (AuxNode *)0x0;
  (this->groups).builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (this->paramStructs).builder.ptr = (AuxNode *)0x0;
  (this->paramStructs).builder.pos = (RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *)0x0;
  (this->paramStructs).builder.endPtr = (AuxNode *)0x0;
  (this->paramStructs).builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (this->unfinishedValues).builder.ptr = (UnfinishedValue *)0x0;
  (this->unfinishedValues).builder.pos =
       (RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *)0x0;
  (this->unfinishedValues).builder.endPtr = (UnfinishedValue *)0x0;
  (this->unfinishedValues).builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  decl_00 = decl->_reader;
  capnp::_::OrphanBuilder::asStruct(&local_100,&(this->wipNode).builder,(StructSize)0x60006);
  builder._builder.capTable = local_100.capTable;
  builder._builder.segment = local_100.segment;
  builder._builder.data = local_100.data;
  builder._builder.pointers = local_100.pointers;
  builder._builder.dataSize = local_100.dataSize;
  builder._builder.pointerCount = local_100.pointerCount;
  builder._builder._38_2_ = local_100._38_2_;
  compileNode(this,(Reader)decl_00,builder);
  return;
}

Assistant:

NodeTranslator::NodeTranslator(
    Resolver& resolver, ErrorReporter& errorReporter,
    const Declaration::Reader& decl, Orphan<schema::Node> wipNodeParam,
    bool compileAnnotations)
    : resolver(resolver), errorReporter(errorReporter),
      orphanage(Orphanage::getForMessageContaining(wipNodeParam.get())),
      compileAnnotations(compileAnnotations),
      localBrand(kj::refcounted<BrandScope>(
          errorReporter, wipNodeParam.getReader().getId(),
          decl.getParameters().size(), resolver)),
      wipNode(kj::mv(wipNodeParam)),
      sourceInfo(orphanage.newOrphan<schema::Node::SourceInfo>()) {
  compileNode(decl, wipNode.get());
}